

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlGetMaxOccurs(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int min,int max,int def,
                   char *expected)

{
  byte *pbVar1;
  int iVar2;
  xmlNodePtr node_00;
  byte *str1;
  byte *pbVar3;
  ulong uVar4;
  xmlChar *unaff_RBX;
  int iVar5;
  undefined4 in_register_00000084;
  undefined4 in_stack_ffffffffffffffc8;
  
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,"maxOccurs");
  if ((node_00 != (xmlNodePtr)0x0) &&
     (str1 = xmlSchemaGetNodeContent(ctxt,node_00), str1 != (byte *)0x0)) {
    iVar2 = xmlStrEqual(str1,"unbounded");
    pbVar3 = str1;
    if (iVar2 == 0) {
      while( true ) {
        uVar4 = (ulong)*pbVar3;
        if (0x20 < uVar4) break;
        if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
          if (uVar4 == 0) goto LAB_0019ac1f;
          break;
        }
        pbVar3 = pbVar3 + 1;
      }
      iVar2 = 0;
      if ((byte)(*pbVar3 - 0x30) < 10) {
        iVar5 = 0;
        do {
          iVar2 = 0x7fffffff;
          if ((iVar5 < 0xccccccd) &&
             (iVar2 = (int)uVar4 + -0x30 + iVar5 * 10, -0x7fffffd1 - (int)uVar4 < iVar5 * 10)) {
            iVar2 = 0x7fffffff;
          }
          pbVar1 = pbVar3 + 1;
          uVar4 = (ulong)*pbVar1;
          pbVar3 = pbVar3 + 1;
          iVar5 = iVar2;
        } while ((byte)(*pbVar1 - 0x30) < 10);
      }
      while (pbVar3 = pbVar3 + 1, (byte)uVar4 < 0x21) {
        if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
          if ((uVar4 == 0) && (min <= iVar2 && iVar2 <= max)) {
            return iVar2;
          }
          break;
        }
        uVar4 = (ulong)*pbVar3;
      }
    }
    else if (max == 0x40000000) {
      return 0x40000000;
    }
LAB_0019ac1f:
    xmlSchemaPSimpleTypeErr
              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)node_00,
               (xmlNodePtr)0x0,(xmlSchemaTypePtr)CONCAT44(in_register_00000084,def),(char *)str1,
               (xmlChar *)0x0,(char *)0x0,(xmlChar *)CONCAT44(min,in_stack_ffffffffffffffc8),
               unaff_RBX);
  }
  return 1;
}

Assistant:

static int
xmlGetMaxOccurs(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
		int min, int max, int def, const char *expected)
{
    const xmlChar *val, *cur;
    int ret = 0;
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(node, "maxOccurs");
    if (attr == NULL)
	return (def);
    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (val == NULL)
        return (def);

    if (xmlStrEqual(val, (const xmlChar *) "unbounded")) {
	if (max != UNBOUNDED) {
	    xmlSchemaPSimpleTypeErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		/* XML_SCHEMAP_INVALID_MINOCCURS, */
		NULL, (xmlNodePtr) attr, NULL, expected,
		val, NULL, NULL, NULL);
	    return (def);
	} else
	    return (UNBOUNDED);  /* encoding it with -1 might be another option */
    }

    cur = val;
    while (IS_BLANK_CH(*cur))
        cur++;
    if (*cur == 0) {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
	return (def);
    }
    while ((*cur >= '0') && (*cur <= '9')) {
        if (ret > INT_MAX / 10) {
            ret = INT_MAX;
        } else {
            int digit = *cur - '0';
            ret *= 10;
            if (ret > INT_MAX - digit)
                ret = INT_MAX;
            else
                ret += digit;
        }
        cur++;
    }
    while (IS_BLANK_CH(*cur))
        cur++;
    /*
    * TODO: Restrict the maximal value to Integer.
    */
    if ((*cur != 0) || (ret < min) || ((max != -1) && (ret > max))) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    return (ret);
}